

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O1

void get_exts(void)

{
  GLubyte *pGVar1;
  long lVar2;
  
  if (GLVersion.major < 3) {
    exts = (char *)(*glad_glGetString)(0x1f03);
  }
  else {
    num_exts_i = 0;
    (*glad_glGetIntegerv)(0x821d,&num_exts_i);
    if (0 < (long)num_exts_i) {
      exts_i = (char **)realloc(exts_i,(long)num_exts_i << 3);
    }
    if (0 < num_exts_i) {
      lVar2 = 0;
      do {
        pGVar1 = (*glad_glGetStringi)(0x1f03,(GLuint)lVar2);
        exts_i[lVar2] = (char *)pGVar1;
        lVar2 = lVar2 + 1;
      } while (lVar2 < num_exts_i);
    }
  }
  return;
}

Assistant:

static void get_exts(void) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(GLVersion.major < 3) {
#endif
        exts = (const char *)glGetString(GL_EXTENSIONS);
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        int index;

        num_exts_i = 0;
        glGetIntegerv(GL_NUM_EXTENSIONS, &num_exts_i);
        if (num_exts_i > 0) {
            exts_i = (const char **)realloc((void *)exts_i, num_exts_i * sizeof *exts_i);
        }

        for(index = 0; index < num_exts_i; index++) {
            exts_i[index] = (const char*)glGetStringi(GL_EXTENSIONS, index);
        }
    }
#endif
}